

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3AtoF(char *z,double *pResult,int length,u8 enc)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  byte *pbVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  byte *pbVar12;
  long lVar13;
  int iVar14;
  bool bVar15;
  longdouble lVar16;
  double dVar17;
  undefined4 uVar20;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double rr [2];
  double local_68;
  double local_60;
  int local_50;
  int local_4c;
  double *local_48;
  
  *pResult = 0.0;
  if (length == 0) {
    return 0;
  }
  if (enc == '\x01') {
    local_4c = 1;
    lVar4 = 1;
    pbVar12 = (byte *)z;
  }
  else {
    uVar11 = 3 - enc;
    uVar3 = (ulong)uVar11;
    local_4c = 1;
    if ((int)uVar11 < (int)(length & 0xfffffffeU)) {
      uVar3 = (ulong)(int)(3 - (uint)enc);
      do {
        if (z[uVar3] != '\0') {
          local_4c = -100;
          goto LAB_0013a86b;
        }
        uVar3 = uVar3 + 2;
      } while ((long)uVar3 < (long)(int)(length & 0xfffffffeU));
      local_4c = 1;
    }
LAB_0013a86b:
    length = (uint)uVar3 ^ 1;
    pbVar12 = (byte *)(z + (enc & 1));
    lVar4 = 2;
  }
  pbVar7 = (byte *)(z + length);
  bVar15 = pbVar12 < pbVar7;
  if (!bVar15) {
    return 0;
  }
  bVar1 = *pbVar12;
  while ((""[bVar1] & 1) != 0) {
    pbVar12 = pbVar12 + lVar4;
    bVar15 = pbVar12 < pbVar7;
    if (!bVar15) {
      return 0;
    }
    bVar1 = *pbVar12;
  }
  if (!bVar15) {
    return 0;
  }
  bVar1 = *pbVar12;
  uVar3 = 0;
  lVar13 = 0;
  if ((bVar1 - 0x2b & 0xfd) == 0) {
    lVar13 = lVar4;
  }
  pbVar12 = pbVar12 + lVar13;
  iVar2 = 1;
  bVar15 = pbVar12 < pbVar7;
  if (bVar15) {
    uVar5 = (ulong)*pbVar12;
    if (uVar5 - 0x3a < 0xfffffffffffffff6) {
      iVar14 = 0;
      iVar6 = 0;
      uVar3 = 0;
    }
    else {
      uVar3 = 0;
      iVar6 = 0;
      iVar14 = 0;
      do {
        uVar3 = ((long)(char)uVar5 + uVar3 * 10) - 0x30;
        pbVar12 = pbVar12 + lVar4;
        if (0x1999999999999997 < uVar3) {
          for (; (pbVar12 < pbVar7 && (0xfffffffffffffff5 < (ulong)*pbVar12 - 0x3a));
              pbVar12 = pbVar12 + lVar4) {
            iVar6 = iVar6 + 1;
          }
        }
        iVar14 = iVar14 + 1;
        bVar15 = pbVar12 < pbVar7;
        if (!bVar15) goto LAB_0013aa2a;
        uVar5 = (ulong)*pbVar12;
      } while (0xfffffffffffffff5 < uVar5 - 0x3a);
    }
    if (bVar15) {
      if (*pbVar12 == 0x2e) {
        local_4c = local_4c + 1;
        while ((pbVar12 = pbVar12 + lVar4, pbVar12 < pbVar7 &&
               (0xfffffffffffffff5 < (ulong)*pbVar12 - 0x3a))) {
          if (uVar3 < 0x1999999999999998) {
            uVar3 = ((long)(char)*pbVar12 + uVar3 * 10) - 0x30;
            iVar6 = iVar6 + -1;
            iVar14 = iVar14 + 1;
          }
        }
      }
      if (pbVar12 < pbVar7) {
        if ((*pbVar12 | 0x20) == 0x65) {
          pbVar12 = pbVar12 + lVar4;
          local_4c = local_4c + 1;
          if (pbVar7 <= pbVar12) {
            iVar10 = 0;
            iVar2 = 1;
            local_50 = 0;
            goto LAB_0013aa30;
          }
          iVar2 = 1;
          if (*pbVar12 == 0x2b) {
            pbVar12 = pbVar12 + lVar4;
          }
          else if (*pbVar12 == 0x2d) {
            pbVar12 = pbVar12 + lVar4;
            iVar2 = -1;
          }
          iVar10 = 0;
          if ((pbVar12 < pbVar7) && (uVar5 = (ulong)*pbVar12, 0xfffffffffffffff5 < uVar5 - 0x3a)) {
            iVar9 = 0;
            do {
              pbVar12 = pbVar12 + lVar4;
              iVar10 = (char)uVar5 + -0x30 + iVar9 * 10;
              if (9999 < iVar9) {
                iVar10 = 10000;
              }
              local_50 = 1;
              if (pbVar7 <= pbVar12) goto LAB_0013afad;
              uVar5 = (ulong)*pbVar12;
              iVar9 = iVar10;
            } while (0xfffffffffffffff5 < uVar5 - 0x3a);
            goto LAB_0013adf7;
          }
          local_50 = 0;
        }
        else {
          iVar10 = 0;
          iVar2 = 1;
LAB_0013adf7:
          local_50 = 1;
        }
LAB_0013afad:
        while ((pbVar12 < pbVar7 && ((""[*pbVar12] & 1) != 0))) {
          pbVar12 = pbVar12 + lVar4;
        }
        goto LAB_0013aa30;
      }
    }
LAB_0013aa2a:
    iVar10 = 0;
    local_50 = 1;
  }
  else {
    iVar6 = 0;
    iVar10 = 0;
    local_50 = 1;
    iVar14 = 0;
  }
LAB_0013aa30:
  if (uVar3 == 0) {
    if (bVar1 == 0x2d) {
      dVar17 = -0.0;
    }
    else {
      dVar17 = 0.0;
    }
  }
  else {
    iVar8 = iVar10 * iVar2 + iVar6;
    uVar5 = uVar3;
    iVar9 = iVar8;
    if ((iVar8 != 0 && SCARRY4(iVar10 * iVar2,iVar6) == iVar8 < 0) && (uVar3 < 0x1999999999999999))
    {
      do {
        uVar5 = uVar3 * 10;
        iVar9 = iVar8 + -1;
        if (iVar8 < 2) break;
        bVar15 = uVar3 < 0x28f5c28f5c28f5d;
        uVar3 = uVar5;
        iVar8 = iVar9;
      } while (bVar15);
    }
    if ((iVar9 < 0) && (iVar2 = iVar9, uVar5 == (uVar5 / 5 & 0xfffffffffffffffe) * 5)) {
      do {
        uVar5 = uVar5 / 10;
        iVar9 = iVar2 + 1;
        if (-2 < iVar2) break;
        iVar2 = iVar9;
      } while (uVar5 == (uVar5 / 10) * 10);
    }
    uVar20 = (undefined4)(uVar5 >> 0x20);
    if (iVar9 == 0) {
      auVar18._8_4_ = uVar20;
      auVar18._0_8_ = uVar5;
      auVar18._12_4_ = 0x45300000;
      *pResult = (auVar18._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0);
    }
    else {
      if (sqlite3Config.bUseLongDouble == '\0') {
        auVar19._8_4_ = uVar20;
        auVar19._0_8_ = uVar5;
        auVar19._12_4_ = 0x45300000;
        local_68 = (auVar19._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0);
        uVar3 = (long)(local_68 - 9.223372036854776e+18) & (long)local_68 >> 0x3f | (long)local_68;
        lVar4 = uVar5 - uVar3;
        if (uVar5 < uVar3) {
          lVar4 = uVar3 - uVar5;
          auVar21._8_4_ = (int)((ulong)lVar4 >> 0x20);
          auVar21._0_8_ = lVar4;
          auVar21._12_4_ = 0x45300000;
          local_60 = -((auVar21._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
        }
        else {
          auVar22._8_4_ = (int)((ulong)lVar4 >> 0x20);
          auVar22._0_8_ = lVar4;
          auVar22._12_4_ = 0x45300000;
          local_60 = (auVar22._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0);
        }
        local_48 = pResult;
        if (iVar9 < 1) {
          if (iVar9 < -99) {
            iVar2 = iVar9;
            do {
              iVar9 = iVar2 + 100;
              dekkerMul2(&local_68,1e-100,-1.9991899802602883e-117);
              bVar15 = iVar2 < -199;
              iVar2 = iVar9;
            } while (bVar15);
          }
          if (iVar9 < -9) {
            iVar2 = iVar9;
            do {
              iVar9 = iVar2 + 10;
              dekkerMul2(&local_68,1e-10,-3.643219731549774e-27);
              bVar15 = iVar2 < -0x13;
              iVar2 = iVar9;
            } while (bVar15);
          }
          if (iVar9 < 0) {
            do {
              dekkerMul2(&local_68,0.1,-5.551115123125783e-18);
              iVar9 = iVar9 + 1;
            } while (iVar9 != 0);
          }
        }
        else {
          if (99 < iVar9) {
            iVar2 = iVar9;
            do {
              iVar9 = iVar2 + -100;
              dekkerMul2(&local_68,1e+100,-1.5902891109759918e+83);
              bVar15 = 199 < iVar2;
              iVar2 = iVar9;
            } while (bVar15);
          }
          if (9 < iVar9) {
            iVar2 = iVar9;
            do {
              iVar9 = iVar2 + -10;
              dekkerMul2(&local_68,10000000000.0,0.0);
              bVar15 = 0x13 < iVar2;
              iVar2 = iVar9;
            } while (bVar15);
          }
          if (0 < iVar9) {
            iVar9 = iVar9 + 1;
            do {
              dekkerMul2(&local_68,10.0,0.0);
              iVar9 = iVar9 + -1;
            } while (1 < iVar9);
          }
        }
        local_68 = local_68 + local_60;
        dVar17 = local_68;
        if (((ulong)local_68 & 0xfffffffffffff) != 0) {
          dVar17 = INFINITY;
        }
        pResult = local_48;
        if ((~(ulong)local_68 & 0x7ff0000000000000) == 0) {
          local_68 = dVar17;
        }
      }
      else {
        lVar16 = (longdouble)(long)uVar5 +
                 (longdouble)*(float *)(&DAT_001c06b8 + (ulong)((long)uVar5 < 0) * 4);
        if (iVar9 < 1) {
          iVar2 = iVar9;
          if (iVar9 < -99) {
            do {
              lVar16 = lVar16 * _DAT_001c04e0;
              iVar2 = iVar9 + 100;
              bVar15 = iVar9 < -199;
              iVar9 = iVar2;
            } while (bVar15);
          }
          iVar6 = iVar2;
          if (iVar2 < -9) {
            do {
              lVar16 = lVar16 * _DAT_001c0500;
              iVar6 = iVar2 + 10;
              bVar15 = iVar2 < -0x13;
              iVar2 = iVar6;
            } while (bVar15);
          }
          if (iVar6 < 0) {
            do {
              lVar16 = lVar16 * _DAT_001c0510;
              iVar6 = iVar6 + 1;
            } while (iVar6 != 0);
          }
        }
        else {
          iVar2 = iVar9;
          if (99 < iVar9) {
            do {
              lVar16 = lVar16 * _DAT_001c0530;
              iVar2 = iVar9 + -100;
              bVar15 = 199 < iVar9;
              iVar9 = iVar2;
            } while (bVar15);
          }
          iVar6 = iVar2;
          if (9 < iVar2) {
            do {
              iVar2 = iVar6 + -10;
              lVar16 = lVar16 * (longdouble)1e+10;
              bVar15 = 0x13 < iVar6;
              iVar6 = iVar2;
            } while (bVar15);
          }
          if (0 < iVar2) {
            iVar2 = iVar2 + 1;
            do {
              lVar16 = lVar16 * (longdouble)10.0;
              iVar2 = iVar2 + -1;
            } while (1 < iVar2);
          }
        }
        local_68 = (double)lVar16;
        if ((longdouble)1.79769313486232e+308 < lVar16) {
          local_68 = INFINITY;
        }
      }
      *pResult = local_68;
    }
    if (bVar1 != 0x2d) goto LAB_0013aede;
    dVar17 = -*pResult;
  }
  *pResult = dVar17;
LAB_0013aede:
  if ((((0 < iVar14 && pbVar12 == pbVar7) & (byte)local_50 & 0 < local_4c) == 0) &&
     (((local_4c < 2 || (local_50 == 0 && local_4c != 3)) || (local_4c = -1, iVar14 < 1)))) {
    local_4c = 0;
  }
  return local_4c;
}

Assistant:

SQLITE_PRIVATE int sqlite3AtoF(const char *z, double *pResult, int length, u8 enc){
#ifndef SQLITE_OMIT_FLOATING_POINT
  int incr;
  const char *zEnd;
  /* sign * significand * (10 ^ (esign * exponent)) */
  int sign = 1;    /* sign of significand */
  u64 s = 0;       /* significand */
  int d = 0;       /* adjust exponent for shifting decimal point */
  int esign = 1;   /* sign of exponent */
  int e = 0;       /* exponent */
  int eValid = 1;  /* True exponent is either not used or is well-formed */
  int nDigit = 0;  /* Number of digits processed */
  int eType = 1;   /* 1: pure integer,  2+: fractional  -1 or less: bad UTF16 */

  assert( enc==SQLITE_UTF8 || enc==SQLITE_UTF16LE || enc==SQLITE_UTF16BE );
  *pResult = 0.0;   /* Default return value, in case of an error */
  if( length==0 ) return 0;

  if( enc==SQLITE_UTF8 ){
    incr = 1;
    zEnd = z + length;
  }else{
    int i;
    incr = 2;
    length &= ~1;
    assert( SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
    testcase( enc==SQLITE_UTF16LE );
    testcase( enc==SQLITE_UTF16BE );
    for(i=3-enc; i<length && z[i]==0; i+=2){}
    if( i<length ) eType = -100;
    zEnd = &z[i^1];
    z += (enc&1);
  }

  /* skip leading spaces */
  while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;
  if( z>=zEnd ) return 0;

  /* get sign of significand */
  if( *z=='-' ){
    sign = -1;
    z+=incr;
  }else if( *z=='+' ){
    z+=incr;
  }

  /* copy max significant digits to significand */
  while( z<zEnd && sqlite3Isdigit(*z) ){
    s = s*10 + (*z - '0');
    z+=incr; nDigit++;
    if( s>=((LARGEST_UINT64-9)/10) ){
      /* skip non-significant significand digits
      ** (increase exponent by d to shift decimal left) */
      while( z<zEnd && sqlite3Isdigit(*z) ){ z+=incr; d++; }
    }
  }
  if( z>=zEnd ) goto do_atof_calc;

  /* if decimal point is present */
  if( *z=='.' ){
    z+=incr;
    eType++;
    /* copy digits from after decimal to significand
    ** (decrease exponent by d to shift decimal right) */
    while( z<zEnd && sqlite3Isdigit(*z) ){
      if( s<((LARGEST_UINT64-9)/10) ){
        s = s*10 + (*z - '0');
        d--;
        nDigit++;
      }
      z+=incr;
    }
  }
  if( z>=zEnd ) goto do_atof_calc;

  /* if exponent is present */
  if( *z=='e' || *z=='E' ){
    z+=incr;
    eValid = 0;
    eType++;

    /* This branch is needed to avoid a (harmless) buffer overread.  The
    ** special comment alerts the mutation tester that the correct answer
    ** is obtained even if the branch is omitted */
    if( z>=zEnd ) goto do_atof_calc;              /*PREVENTS-HARMLESS-OVERREAD*/

    /* get sign of exponent */
    if( *z=='-' ){
      esign = -1;
      z+=incr;
    }else if( *z=='+' ){
      z+=incr;
    }
    /* copy digits to exponent */
    while( z<zEnd && sqlite3Isdigit(*z) ){
      e = e<10000 ? (e*10 + (*z - '0')) : 10000;
      z+=incr;
      eValid = 1;
    }
  }

  /* skip trailing spaces */
  while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;

do_atof_calc:
  /* Zero is a special case */
  if( s==0 ){
    *pResult = sign<0 ? -0.0 : +0.0;
    goto atof_return;
  }

  /* adjust exponent by d, and update sign */
  e = (e*esign) + d;

  /* Try to adjust the exponent to make it smaller */
  while( e>0 && s<(LARGEST_UINT64/10) ){
    s *= 10;
    e--;
  }
  while( e<0 && (s%10)==0 ){
    s /= 10;
    e++;
  }

  if( e==0 ){
    *pResult = s;
  }else if( sqlite3Config.bUseLongDouble ){
    LONGDOUBLE_TYPE r = (LONGDOUBLE_TYPE)s;
    if( e>0 ){
      while( e>=100  ){ e-=100; r *= 1.0e+100L; }
      while( e>=10   ){ e-=10;  r *= 1.0e+10L;  }
      while( e>=1    ){ e-=1;   r *= 1.0e+01L;  }
    }else{
      while( e<=-100 ){ e+=100; r *= 1.0e-100L; }
      while( e<=-10  ){ e+=10;  r *= 1.0e-10L;  }
      while( e<=-1   ){ e+=1;   r *= 1.0e-01L;  }
    }
    assert( r>=0.0 );
    if( r>+1.7976931348623157081452742373e+308L ){
#ifdef INFINITY
      *pResult = +INFINITY;
#else
      *pResult = 1.0e308*10.0;
#endif
    }else{
      *pResult = (double)r;
    }
  }else{
    double rr[2];
    u64 s2;
    rr[0] = (double)s;
    s2 = (u64)rr[0];
#if defined(_MSC_VER) && _MSC_VER<1700
    if( s2==0x8000000000000000LL ){ s2 = 2*(u64)(0.5*rr[0]); }
#endif
    rr[1] = s>=s2 ? (double)(s - s2) : -(double)(s2 - s);
    if( e>0 ){
      while( e>=100  ){
        e -= 100;
        dekkerMul2(rr, 1.0e+100, -1.5902891109759918046e+83);
      }
      while( e>=10   ){
        e -= 10;
        dekkerMul2(rr, 1.0e+10, 0.0);
      }
      while( e>=1    ){
        e -= 1;
        dekkerMul2(rr, 1.0e+01, 0.0);
      }
    }else{
      while( e<=-100 ){
        e += 100;
        dekkerMul2(rr, 1.0e-100, -1.99918998026028836196e-117);
      }
      while( e<=-10  ){
        e += 10;
        dekkerMul2(rr, 1.0e-10, -3.6432197315497741579e-27);
      }
      while( e<=-1   ){
        e += 1;
        dekkerMul2(rr, 1.0e-01, -5.5511151231257827021e-18);
      }
    }
    *pResult = rr[0]+rr[1];
    if( sqlite3IsNaN(*pResult) ) *pResult = 1e300*1e300;
  }
  if( sign<0 ) *pResult = -*pResult;
  assert( !sqlite3IsNaN(*pResult) );

atof_return:
  /* return true if number and no extra non-whitespace characters after */
  if( z==zEnd && nDigit>0 && eValid && eType>0 ){
    return eType;
  }else if( eType>=2 && (eType==3 || eValid) && nDigit>0 ){
    return -1;
  }else{
    return 0;
  }
#else
  return !sqlite3Atoi64(z, pResult, length, enc);
#endif /* SQLITE_OMIT_FLOATING_POINT */
}